

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_interactive.cpp
# Opt level: O2

string * __thiscall
ftxui::(anonymous_namespace)::Serialize_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
          *parameters)

{
  int __val;
  int *piVar1;
  bool bVar2;
  int *piVar3;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  piVar1 = *(int **)(this + 8);
  bVar2 = true;
  for (piVar3 = *(int **)this; piVar3 != piVar1; piVar3 = piVar3 + 1) {
    __val = *piVar3;
    if (!bVar2) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::to_string(&local_50,__val);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    bVar2 = false;
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string Serialize(std::vector<DECMode> parameters) {
  bool first = true;
  std::string out;
  for (DECMode parameter : parameters) {
    if (!first)
      out += ";";
    out += std::to_string(int(parameter));
    first = false;
  }
  return out;
}